

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_primitives_conversion.cpp
# Opt level: O3

void skiwi::anon_unknown_2::inline_vector_length(PrimitiveCall *p,Expression *e)

{
  string prim_name;
  bool check_binding;
  byte bVar1;
  string *in_stack_ffffffffffffff48;
  string *first_arg_check;
  string *in_stack_ffffffffffffff58;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  bVar1 = (anonymous_namespace)::g_standard_bindings;
  check_binding = (bool)(anonymous_namespace)::g_safe_primitives;
  first_arg_check = (string *)local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff50,"vector-length","");
  local_90._M_allocated_capacity = (size_type)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x10),"##vector-length","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"##vector?","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  prim_name._M_string_length = (size_type)(local_a0 + 0x10);
  prim_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff58;
  prim_name.field_2._M_allocated_capacity = (size_type)local_50;
  prim_name.field_2._8_8_ = (string *)local_70;
  make_inline_procedure
            ((anon_unknown_2 *)p,(PrimitiveCall *)e,(Expression *)0x1,(uint)(bVar1 ^ 1),
             check_binding,SUB81(first_arg_check,0),prim_name,in_stack_ffffffffffffff48,
             first_arg_check,in_stack_ffffffffffffff58);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((long *)local_90._M_allocated_capacity != local_80) {
    operator_delete((void *)local_90._M_allocated_capacity,local_80[0] + 1);
  }
  if (first_arg_check != (string *)local_a0) {
    operator_delete(first_arg_check,(ulong)(local_a0._0_8_ + 1));
  }
  return;
}

Assistant:

void inline_vector_length(PrimitiveCall& p, Expression& e)
    {
    make_inline_procedure(p, e, 1, !g_standard_bindings, g_safe_primitives, "vector-length", "##vector-length", "##vector?");
    }